

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O0

void __thiscall kratos::IfStmt::clear(IfStmt *this)

{
  element_type *peVar1;
  element_type *peVar2;
  IfStmt *this_local;
  
  peVar1 = std::__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->predicate_stmt_);
  (*(peVar1->super_Stmt).super_IRNode._vptr_IRNode[0xc])();
  peVar2 = std::
           __shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->then_body_);
  (*(peVar2->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[0xc])();
  peVar2 = std::
           __shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::ScopedStmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->else_body_);
  (*(peVar2->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode[0xc])();
  return;
}

Assistant:

void IfStmt::clear() {
    predicate_stmt_->clear();
    then_body_->clear();
    else_body_->clear();
}